

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_pcmpeqw_mipsel(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    *(uint *)((long)&vs + lVar1 * 4) =
         -(uint)(*(int *)((long)&vs + lVar1 * 4) == *(int *)((long)&vt + lVar1 * 4));
  }
  return vs.d;
}

Assistant:

uint64_t helper_pcmpeqw(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 2; i++) {
        vs.uw[i] = -(vs.uw[i] == vt.uw[i]);
    }
    return vs.d;
}